

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

StorageClass __thiscall
spirv_cross::Compiler::get_expression_effective_storage_class(Compiler *this,uint32_t ptr)

{
  Types TVar1;
  uint32_t id;
  SPIRVariable *pSVar2;
  Variant *this_00;
  SPIRExpression *pSVar3;
  size_type sVar4;
  SPIRType *pSVar5;
  bool bVar6;
  bool forced_temporary;
  SPIRVariable *var;
  Compiler *pCStack_18;
  uint32_t ptr_local;
  Compiler *this_local;
  
  var._4_4_ = ptr;
  pCStack_18 = this;
  pSVar2 = maybe_get_backing_variable(this,ptr);
  this_00 = VectorView<spirv_cross::Variant>::operator[]
                      (&(this->ir).ids.super_VectorView<spirv_cross::Variant>,(ulong)var._4_4_);
  TVar1 = Variant::get_type(this_00);
  bVar6 = false;
  if (TVar1 == TypeExpression) {
    pSVar3 = get<spirv_cross::SPIRExpression>(this,var._4_4_);
    bVar6 = false;
    if ((pSVar3->access_chain & 1U) == 0) {
      sVar4 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::count(&this->forced_temporaries,(key_type *)((long)&var + 4));
      bVar6 = true;
      if (sVar4 == 0) {
        sVar4 = ::std::
                unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                ::count(&this->forwarded_temporaries,(key_type *)((long)&var + 4));
        bVar6 = sVar4 == 0;
      }
    }
  }
  if ((pSVar2 == (SPIRVariable *)0x0) || (bVar6)) {
    pSVar5 = expression_type(this,var._4_4_);
    this_local._4_4_ = pSVar5->storage;
  }
  else {
    if (pSVar2->storage == StorageClassUniform) {
      id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar2->super_IVariant).field_0xc);
      pSVar5 = get<spirv_cross::SPIRType>(this,id);
      bVar6 = has_decoration(this,(ID)(pSVar5->super_IVariant).self.id,DecorationBufferBlock);
      if (bVar6) {
        return StorageClassStorageBuffer;
      }
    }
    this_local._4_4_ = pSVar2->storage;
  }
  return this_local._4_4_;
}

Assistant:

StorageClass Compiler::get_expression_effective_storage_class(uint32_t ptr)
{
	auto *var = maybe_get_backing_variable(ptr);

	// If the expression has been lowered to a temporary, we need to use the Generic storage class.
	// We're looking for the effective storage class of a given expression.
	// An access chain or forwarded OpLoads from such access chains
	// will generally have the storage class of the underlying variable, but if the load was not forwarded
	// we have lost any address space qualifiers.
	bool forced_temporary = ir.ids[ptr].get_type() == TypeExpression && !get<SPIRExpression>(ptr).access_chain &&
	                        (forced_temporaries.count(ptr) != 0 || forwarded_temporaries.count(ptr) == 0);

	if (var && !forced_temporary)
	{
		// Normalize SSBOs to StorageBuffer here.
		if (var->storage == StorageClassUniform &&
		    has_decoration(get<SPIRType>(var->basetype).self, DecorationBufferBlock))
			return StorageClassStorageBuffer;
		else
			return var->storage;
	}
	else
		return expression_type(ptr).storage;
}